

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver)

{
  int iVar1;
  int iVar2;
  void *__dest;
  long lVar3;
  undefined8 *in_RDI;
  double dVar4;
  int i_1;
  int i_hi;
  int i_lo;
  int i;
  double *A;
  double *old_A;
  double mean;
  int result;
  double kAlpha;
  int n;
  int local_58;
  int local_54;
  int iVar5;
  int in_stack_ffffffffffffffb4;
  int local_44;
  aom_equation_system_t *eqns;
  int local_4;
  
  iVar1 = *(int *)(in_RDI + 6);
  dVar4 = ((double)*(int *)((long)in_RDI + 0x34) * 2.0) / (double)iVar1;
  eqns = (aom_equation_system_t *)*in_RDI;
  __dest = aom_malloc(0xeaf460);
  if (__dest == (void *)0x0) {
    fprintf(_stderr,"Unable to allocate copy of A\n");
    local_4 = 0;
  }
  else {
    memcpy(__dest,eqns,(long)iVar1 * 8 * (long)iVar1);
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      if (local_44 + -1 < 0) {
        local_54 = 0;
      }
      else {
        local_54 = local_44 + -1;
      }
      if (iVar1 + -1 < local_44 + 1) {
        local_58 = iVar1 + -1;
      }
      else {
        local_58 = local_44 + 1;
      }
      lVar3 = (long)(local_44 * iVar1 + local_54);
      *(double *)((long)__dest + lVar3 * 8) = *(double *)((long)__dest + lVar3 * 8) - dVar4;
      lVar3 = (long)(local_44 * iVar1 + local_44);
      *(double *)((long)__dest + lVar3 * 8) = dVar4 + dVar4 + *(double *)((long)__dest + lVar3 * 8);
      lVar3 = (long)(local_44 * iVar1 + local_58);
      *(double *)((long)__dest + lVar3 * 8) = *(double *)((long)__dest + lVar3 * 8) - dVar4;
      in_stack_ffffffffffffffb4 = local_58;
    }
    dVar4 = (double)in_RDI[7];
    iVar2 = *(int *)((long)in_RDI + 0x34);
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      lVar3 = (long)(iVar5 * iVar1 + iVar5);
      *(double *)((long)__dest + lVar3 * 8) =
           *(double *)((long)__dest + lVar3 * 8) + 0.0001220703125;
      *(double *)(in_RDI[1] + (long)iVar5 * 8) =
           (dVar4 / (double)iVar2) / 8192.0 + *(double *)(in_RDI[1] + (long)iVar5 * 8);
    }
    *in_RDI = __dest;
    local_4 = equation_system_solve(eqns);
    *in_RDI = eqns;
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffb4,iVar5));
  }
  return local_4;
}

Assistant:

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver) {
  // Add regularization proportional to the number of constraints
  const int n = solver->num_bins;
  const double kAlpha = 2.0 * (double)(solver->num_equations) / n;
  int result = 0;
  double mean = 0;

  // Do this in a non-destructive manner so it is not confusing to the caller
  double *old_A = solver->eqns.A;
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  if (!A) {
    fprintf(stderr, "Unable to allocate copy of A\n");
    return 0;
  }
  memcpy(A, old_A, sizeof(*A) * n * n);

  for (int i = 0; i < n; ++i) {
    const int i_lo = AOMMAX(0, i - 1);
    const int i_hi = AOMMIN(n - 1, i + 1);
    A[i * n + i_lo] -= kAlpha;
    A[i * n + i] += 2 * kAlpha;
    A[i * n + i_hi] -= kAlpha;
  }

  // Small regularization to give average noise strength
  mean = solver->total / solver->num_equations;
  for (int i = 0; i < n; ++i) {
    A[i * n + i] += 1.0 / 8192.;
    solver->eqns.b[i] += mean / 8192.;
  }
  solver->eqns.A = A;
  result = equation_system_solve(&solver->eqns);
  solver->eqns.A = old_A;

  aom_free(A);
  return result;
}